

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O1

enable_if_t<std::is_arithmetic<unsigned_short>::value,_bool> __thiscall
beast::detail::LexicalCast<std::__cxx11::string,unsigned_short>::operator()
          (void *this,string *out,unsigned_short in)

{
  undefined6 in_register_00000012;
  uint __len;
  string __str;
  long *local_48 [2];
  long local_38 [2];
  
  __len = 1;
  if ((9 < in) && (__len = 2, 99 < in)) {
    __len = 3;
    if (999 < in) {
      __len = 5 - (in < 10000);
    }
  }
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,(char)__len);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_48[0],__len,(uint)CONCAT62(in_register_00000012,in));
  std::__cxx11::string::operator=((string *)out,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return true;
}

Assistant:

std::enable_if_t <std::is_arithmetic <Arithmetic>::value, bool>
    operator () (std::string& out, Arithmetic in)
    {
        out = std::to_string (in);
        return true;
    }